

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

CRef __thiscall Minisat::Solver::simplePropagate(Solver *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Lit *pLVar4;
  Watcher *pWVar5;
  long in_RDI;
  Watcher w;
  int k_1;
  Lit first;
  Lit false_lit;
  Clause *c;
  CRef cr;
  Lit blocker;
  Lit imp;
  int k;
  vec<Minisat::Watcher> *wbin;
  Watcher *end;
  Watcher *j;
  Watcher *i;
  vec<Minisat::Watcher> *ws;
  Lit p;
  int num_props;
  CRef confl;
  Watcher *in_stack_fffffffffffffee8;
  vec<Minisat::Watcher> *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  uint uVar6;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
  *in_stack_ffffffffffffff00;
  Lit in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  Lit in_stack_ffffffffffffff2c;
  lbool local_cd;
  Lit in_stack_ffffffffffffff34;
  Watcher local_c0;
  lbool local_b5;
  int local_b4;
  uint8_t local_ad;
  int local_ac;
  lbool local_a5;
  CRef local_a4;
  lbool local_9d;
  int local_9c;
  Lit local_98;
  int local_94;
  int local_90;
  Lit local_8c;
  Clause *local_88;
  CRef local_7c;
  lbool local_75;
  int local_74;
  lbool local_6d;
  Lit local_6c;
  int local_68;
  lbool local_61;
  int local_60;
  lbool local_5a;
  lbool local_59;
  int local_58;
  lbool local_51;
  int local_50;
  int local_4c;
  vec<Minisat::Watcher> *local_48;
  Watcher *local_40;
  Watcher *local_38;
  Watcher *local_30;
  vec<Minisat::Watcher> *local_28;
  Lit local_1c;
  int local_18;
  CRef local_14;
  
  local_14 = 0xffffffff;
  local_18 = 0;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            (in_stack_ffffffffffffff00);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            (in_stack_ffffffffffffff00);
  do {
    iVar3 = *(int *)(in_RDI + 0x380);
    iVar2 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x350));
    if (iVar2 <= iVar3) {
      *(long *)(in_RDI + 0x6b8) = (long)local_18 + *(long *)(in_RDI + 0x6b8);
      return local_14;
    }
    iVar3 = *(int *)(in_RDI + 0x380);
    *(int *)(in_RDI + 0x380) = iVar3 + 1;
    pLVar4 = vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0x350),iVar3);
    local_1c.x = pLVar4->x;
    local_28 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::
               operator[](in_stack_ffffffffffffff00,
                          (Lit *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_18 = local_18 + 1;
    local_48 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::
               operator[](in_stack_ffffffffffffff00,
                          (Lit *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    for (local_4c = 0; iVar3 = local_4c, iVar2 = vec<Minisat::Watcher>::size(local_48),
        iVar3 < iVar2; local_4c = local_4c + 1) {
      pWVar5 = vec<Minisat::Watcher>::operator[](local_48,local_4c);
      local_58 = (pWVar5->blocker).x;
      local_50 = local_58;
      local_51 = value((Solver *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (Lit)(int)in_stack_ffffffffffffff00);
      lbool::lbool(&local_59,'\x01');
      bVar1 = lbool::operator==(&local_51,local_59);
      if (bVar1) {
        pWVar5 = vec<Minisat::Watcher>::operator[](local_48,local_4c);
        return pWVar5->cref;
      }
      local_60 = local_50;
      local_5a = value((Solver *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (Lit)(int)in_stack_ffffffffffffff00);
      lbool::lbool(&local_61,'\x02');
      bVar1 = lbool::operator==(&local_5a,local_61);
      if (bVar1) {
        local_68 = local_50;
        vec<Minisat::Watcher>::operator[](local_48,local_4c);
        simpleUncheckEnqueue
                  ((Solver *)CONCAT44(in_stack_ffffffffffffff2c.x,in_stack_ffffffffffffff28),
                   in_stack_ffffffffffffff34,in_stack_ffffffffffffff24.x);
      }
    }
    pWVar5 = Minisat::vec::operator_cast_to_Watcher_((vec *)local_28);
    local_38 = pWVar5;
    local_30 = pWVar5;
    iVar3 = vec<Minisat::Watcher>::size(local_28);
    local_40 = pWVar5 + iVar3;
LAB_0012e03d:
    if (local_30 != local_40) {
      local_74 = (local_30->blocker).x;
      local_6c.x = local_74;
      local_6d = value((Solver *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (Lit)(int)in_stack_ffffffffffffff00);
      lbool::lbool(&local_75,'\0');
      bVar1 = lbool::operator==(&local_6d,local_75);
      if (bVar1) {
        *local_38 = *local_30;
        local_38 = local_38 + 1;
        local_30 = local_30 + 1;
      }
      else {
        local_7c = local_30->cref;
        local_88 = ClauseAllocator::operator[]
                             ((ClauseAllocator *)in_stack_fffffffffffffef0,
                              (Ref)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        local_90 = local_1c.x;
        local_8c = operator~(local_1c);
        pLVar4 = Clause::operator[](local_88,0);
        local_94 = local_8c.x;
        bVar1 = Lit::operator==(pLVar4,local_8c);
        uVar6 = in_stack_fffffffffffffefc;
        if (bVar1) {
          in_stack_ffffffffffffff00 =
               (OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
               Clause::operator[](local_88,1);
          pLVar4 = Clause::operator[](local_88,0);
          pLVar4->x = *(int *)&(in_stack_ffffffffffffff00->occs).data;
          pLVar4 = Clause::operator[](local_88,1);
          pLVar4->x = local_8c.x;
          uVar6 = in_stack_fffffffffffffefc;
        }
        pLVar4 = Clause::operator[](local_88,0);
        local_98.x = pLVar4->x;
        local_9c = local_6c.x;
        bVar1 = Lit::operator!=(&local_98,local_6c);
        in_stack_fffffffffffffefc = uVar6 & 0xffffff;
        if (bVar1) {
          local_a4 = local_98.x;
          local_9d = value((Solver *)(CONCAT44(uVar6,in_stack_fffffffffffffef8) & 0xffffffffffffff),
                           (Lit)(int)in_stack_ffffffffffffff00);
          lbool::lbool(&local_a5,'\0');
          bVar1 = lbool::operator==(&local_9d,local_a5);
          in_stack_fffffffffffffefc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffefc);
        }
        if ((char)(in_stack_fffffffffffffefc >> 0x18) == '\0') {
          local_ac = 2;
          while (in_stack_fffffffffffffef8 = local_ac, iVar3 = Clause::size(local_88),
                in_stack_fffffffffffffef8 < iVar3) {
            pLVar4 = Clause::operator[](local_88,local_ac);
            local_b4 = pLVar4->x;
            local_ad = (uint8_t)value((Solver *)
                                      CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                      (Lit)(int)in_stack_ffffffffffffff00);
            lbool::lbool(&local_b5,'\x01');
            bVar1 = lbool::operator!=((lbool *)in_stack_fffffffffffffee8,
                                      (lbool)(uint8_t)((ulong)in_stack_fffffffffffffef0 >> 0x38));
            if (bVar1) {
              Watcher::Watcher(&local_c0,local_7c,local_98);
              local_30 = local_30 + 1;
              in_stack_fffffffffffffee8 = (Watcher *)Clause::operator[](local_88,local_ac);
              pLVar4 = Clause::operator[](local_88,1);
              pLVar4->x = in_stack_fffffffffffffee8->cref;
              pLVar4 = Clause::operator[](local_88,local_ac);
              pLVar4->x = local_8c.x;
              in_stack_fffffffffffffef0 = (vec<Minisat::Watcher> *)(in_RDI + 0x2e8);
              pLVar4 = Clause::operator[](local_88,1);
              in_stack_ffffffffffffff34.x = pLVar4->x;
              operator~(in_stack_ffffffffffffff34);
              OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::
              operator[](in_stack_ffffffffffffff00,
                         (Lit *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
              vec<Minisat::Watcher>::push(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
              goto LAB_0012e03d;
            }
            local_ac = local_ac + 1;
          }
          (local_30->blocker).x = local_98.x;
          *local_38 = *local_30;
          in_stack_ffffffffffffff2c.x = local_98.x;
          local_38 = local_38 + 1;
          local_30 = local_30 + 1;
          local_cd = value((Solver *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                           (Lit)(int)in_stack_ffffffffffffff00);
          lbool::lbool((lbool *)&stack0xffffffffffffff2b,'\x01');
          bVar1 = lbool::operator==(&local_cd,
                                    (lbool)(uint8_t)((uint)in_stack_ffffffffffffff28 >> 0x18));
          if (bVar1) {
            local_14 = local_7c;
            iVar3 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x350));
            *(int *)(in_RDI + 0x380) = iVar3;
            while (local_30 < local_40) {
              *local_38 = *local_30;
              local_38 = local_38 + 1;
              local_30 = local_30 + 1;
            }
          }
          else {
            in_stack_ffffffffffffff24.x = local_98.x;
            simpleUncheckEnqueue
                      ((Solver *)CONCAT44(in_stack_ffffffffffffff2c.x,in_stack_ffffffffffffff28),
                       in_stack_ffffffffffffff34,local_98.x);
          }
        }
        else {
          (local_30->blocker).x = local_98.x;
          *local_38 = *local_30;
          local_38 = local_38 + 1;
          local_30 = local_30 + 1;
        }
      }
      goto LAB_0012e03d;
    }
    vec<Minisat::Watcher>::shrink(local_28,(int)((long)local_30 - (long)local_38 >> 3));
  } while( true );
}

Assistant:

CRef Solver::simplePropagate()
{
    CRef confl = CRef_Undef;
    int num_props = 0;
    watches.cleanAll();
    watches_bin.cleanAll();
    while (qhead < trail.size()) {
        Lit p = trail[qhead++]; // 'p' is enqueued fact to propagate.
        vec<Watcher> &ws = watches[p];
        Watcher *i, *j, *end;
        num_props++;


        // First, Propagate binary clauses
        vec<Watcher> &wbin = watches_bin[p];

        for (int k = 0; k < wbin.size(); k++) {

            Lit imp = wbin[k].blocker;

            if (value(imp) == l_False) {
                return wbin[k].cref;
            }

            if (value(imp) == l_Undef) {
                simpleUncheckEnqueue(imp, wbin[k].cref);
            }
        }
        for (i = j = (Watcher *)ws, end = i + ws.size(); i != end;) {
            // Try to avoid inspecting the clause:
            Lit blocker = i->blocker;
            if (value(blocker) == l_True) {
                *j++ = *i++;
                continue;
            }

            // Make sure the false literal is data[1]:
            CRef cr = i->cref;
            Clause &c = ca[cr];
            Lit false_lit = ~p;
            if (c[0] == false_lit) c[0] = c[1], c[1] = false_lit;
            assert(c[1] == false_lit);
            //  i++;

            // If 0th watch is true, then clause is already satisfied.
            // However, 0th watch is not the blocker, make it blocker using a new watcher w
            // why not simply do i->blocker=first in this case?
            Lit first = c[0];
            //  Watcher w     = Watcher(cr, first);
            if (first != blocker && value(first) == l_True) {
                i->blocker = first;
                *j++ = *i++;
                continue;
            }

            // Look for new watch:
            // if (incremental)
            //{ // ----------------- INCREMENTAL MODE
            //	int choosenPos = -1;
            //	for (int k = 2; k < c.size(); k++)
            //	{
            //		if (value(c[k]) != l_False)
            //		{
            //			if (decisionLevel()>assumptions.size())
            //			{
            //				choosenPos = k;
            //				break;
            //			}
            //			else
            //			{
            //				choosenPos = k;

            //				if (value(c[k]) == l_True || !isSelector(var(c[k]))) {
            //					break;
            //				}
            //			}

            //		}
            //	}
            //	if (choosenPos != -1)
            //	{
            //		// watcher i is abandonned using i++, because cr watches now ~c[k] instead of p
            //		// the blocker is first in the watcher. However,
            //		// the blocker in the corresponding watcher in ~first is not c[1]
            //		Watcher w = Watcher(cr, first); i++;
            //		c[1] = c[choosenPos]; c[choosenPos] = false_lit;
            //		watches[~c[1]].push(w);
            //		goto NextClause;
            //	}
            //}
            else { // ----------------- DEFAULT  MODE (NOT INCREMENTAL)
                for (int k = 2; k < c.size(); k++) {

                    if (value(c[k]) != l_False) {
                        // watcher i is abandonned using i++, because cr watches now ~c[k] instead of p
                        // the blocker is first in the watcher. However,
                        // the blocker in the corresponding watcher in ~first is not c[1]
                        Watcher w = Watcher(cr, first);
                        i++;
                        c[1] = c[k];
                        c[k] = false_lit;
                        watches[~c[1]].push(w);
                        goto NextClause;
                    }
                }
            }

            // Did not find watch -- clause is unit under assignment:
            i->blocker = first;
            *j++ = *i++;
            if (value(first) == l_False) {
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while (i < end) *j++ = *i++;
            } else {
                simpleUncheckEnqueue(first, cr);
            }
        NextClause:;
        }
        ws.shrink(i - j);
    }

    s_propagations += num_props;

    return confl;
}